

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnEventSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index event_index)

{
  Module *pMVar1;
  pointer ppEVar2;
  string_view name_00;
  string *orig_name;
  Enum EVar3;
  char *in_stack_ffffffffffffff78;
  Event *pEVar4;
  string dollar_name;
  __buckets_ptr local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  float local_38;
  
  orig_name = (string *)name.data_;
  EVar3 = Ok;
  if (name.size_ != 0) {
    pMVar1 = this->module_;
    ppEVar2 = (pMVar1->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)event_index <
        (ulong)((long)(pMVar1->events).
                      super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3)) {
      pEVar4 = ppEVar2[event_index];
      name_00.size_ = (size_type)pEVar4;
      name_00.data_ = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName(&dollar_name,(BinaryReaderIR *)&pMVar1->event_bindings,(BindingHash *)&local_58,
                    orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pEVar4);
      uStack_48 = 0;
      uStack_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_38 = (float)event_index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->event_bindings,&dollar_name,&local_58);
      std::__cxx11::string::_M_dispose();
    }
    else {
      PrintError(this,"invalid event index: %u",(ulong)event_index);
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnEventSymbol(Index index, uint32_t flags,
                                     string_view name, Index event_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (event_index >= module_->events.size()) {
    PrintError("invalid event index: %" PRIindex, event_index);
    return Result::Error;
  }
  Event* event = module_->events[event_index];
  std::string dollar_name =
      GetUniqueName(&module_->event_bindings, MakeDollarName(name));
  event->name = dollar_name;
  module_->event_bindings.emplace(dollar_name, Binding(event_index));
  return Result::Ok;
}